

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

void WScriptJsrt::SetExceptionIf(JsErrorCode errorCode,LPCWSTR errorMessage)

{
  JsValueRef pvVar1;
  JsErrorCode JVar2;
  int iVar3;
  HRESULT HVar4;
  size_t sVar5;
  JsValueRef local_38;
  JsValueRef errorMessageString;
  JsValueRef errorObject;
  bool hasException;
  
  if (errorCode != JsNoError) {
    errorObject._7_1_ = '\0';
    JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtHasException)((bool *)((long)&errorObject + 7));
    if ((JVar2 != JsNoError) || (errorObject._7_1_ == '\0')) {
      iVar3 = PAL_wcscmp(errorMessage,L"");
      if (iVar3 == 0) {
        errorMessage = ConvertErrorCodeToMessage(errorCode);
      }
      HVar4 = utf8::WideStringToNarrowDynamic(errorMessage,(LPSTR *)&errorMessageString);
      pvVar1 = errorMessageString;
      if (HVar4 < 0) {
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                  ("Failed to convert wide string. Out of memory?",0x2d,&local_38);
      }
      else {
        sVar5 = strlen((char *)errorMessageString);
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)((char *)pvVar1,sVar5,&local_38);
        free(errorMessageString);
      }
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateError)(local_38,&errorMessageString);
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetException)(errorMessageString);
    }
  }
  return;
}

Assistant:

void WScriptJsrt::SetExceptionIf(JsErrorCode errorCode, LPCWSTR errorMessage)
{
    if (errorCode != JsNoError)
    {
        // If the exception is already is set - no need to create a new exception.
        bool hasException = false;
        if (!(ChakraRTInterface::JsHasException(&hasException) == JsNoError && hasException))
        {
            JsValueRef errorObject;
            JsValueRef errorMessageString;

            if (wcscmp(errorMessage, _u("")) == 0)
            {
                errorMessage = ConvertErrorCodeToMessage(errorCode);
            }

            ERROR_MESSAGE_TO_STRING(errCode, errorMessage, errorMessageString);

            ChakraRTInterface::JsCreateError(errorMessageString, &errorObject);
            ChakraRTInterface::JsSetException(errorObject);
        }
    }
}